

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::PrimitiveTypeName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Options *options,CppType type)

{
  LogMessage *other;
  allocator local_10a;
  LogFinisher local_109;
  LogMessage local_108;
  allocator local_cf;
  allocator local_ce;
  allocator local_cd;
  allocator local_cc;
  allocator local_cb;
  allocator local_ca;
  allocator local_c9;
  string local_c8;
  allocator local_a1;
  string local_a0;
  allocator local_79;
  string local_78;
  allocator local_41;
  string local_40;
  undefined4 local_1c;
  cpp *pcStack_18;
  CppType type_local;
  Options *options_local;
  
  local_1c = SUB84(options,0);
  pcStack_18 = this;
  options_local = (Options *)__return_storage_ptr__;
  switch(local_1c) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"int32",&local_41);
    anon_unknown_0::IntTypeName(__return_storage_ptr__,(Options *)this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_78,"int64",&local_79);
    anon_unknown_0::IntTypeName(__return_storage_ptr__,(Options *)this,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a0,"uint32",&local_a1);
    anon_unknown_0::IntTypeName(__return_storage_ptr__,(Options *)this,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_c8,"uint64",&local_c9);
    anon_unknown_0::IntTypeName(__return_storage_ptr__,(Options *)this,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"double",&local_ca);
    std::allocator<char>::~allocator((allocator<char> *)&local_ca);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"float",&local_cb);
    std::allocator<char>::~allocator((allocator<char> *)&local_cb);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"bool",&local_cc);
    std::allocator<char>::~allocator((allocator<char> *)&local_cc);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"int",&local_cd);
    std::allocator<char>::~allocator((allocator<char> *)&local_cd);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"std::string",&local_ce);
    std::allocator<char>::~allocator((allocator<char> *)&local_ce);
    break;
  case 10:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_cf);
    std::allocator<char>::~allocator((allocator<char> *)&local_cf);
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_108,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x24f);
    other = internal::LogMessage::operator<<(&local_108,"Can\'t get here.");
    internal::LogFinisher::operator=(&local_109,other);
    internal::LogMessage::~LogMessage(&local_108);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_10a);
    std::allocator<char>::~allocator((allocator<char> *)&local_10a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PrimitiveTypeName(const Options& options,
                              FieldDescriptor::CppType type) {
  switch (type) {
    case FieldDescriptor::CPPTYPE_INT32:
      return IntTypeName(options, "int32");
    case FieldDescriptor::CPPTYPE_INT64:
      return IntTypeName(options, "int64");
    case FieldDescriptor::CPPTYPE_UINT32:
      return IntTypeName(options, "uint32");
    case FieldDescriptor::CPPTYPE_UINT64:
      return IntTypeName(options, "uint64");
    case FieldDescriptor::CPPTYPE_DOUBLE:
      return "double";
    case FieldDescriptor::CPPTYPE_FLOAT:
      return "float";
    case FieldDescriptor::CPPTYPE_BOOL:
      return "bool";
    case FieldDescriptor::CPPTYPE_ENUM:
      return "int";
    case FieldDescriptor::CPPTYPE_STRING:
      return "std::string";
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return "";

      // No default because we want the compiler to complain if any new
      // CppTypes are added.
  }

  GOOGLE_LOG(FATAL) << "Can't get here.";
  return "";
}